

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derEnc(octet *der,u32 tag,void *val,size_t len)

{
  void *dest;
  void *src;
  void *pvVar1;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t l_count;
  size_t t_count;
  u32 tag_00;
  undefined4 in_stack_ffffffffffffffe8;
  size_t local_8;
  
  tag_00 = (u32)((ulong)in_RDX >> 0x20);
  dest = (void *)derTEnc((octet *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),tag_00);
  if (dest == (void *)0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    src = (void *)derLEnc((octet *)0x0,in_RCX);
    if (src == (void *)0xffffffffffffffff) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      if (in_RDI != 0) {
        memMove(dest,src,0x1122f8);
        pvVar1 = (void *)derTEnc((octet *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),tag_00);
        if ((pvVar1 != dest) ||
           (pvVar1 = (void *)derLEnc((octet *)(in_RDI + (long)dest),in_RCX), pvVar1 != src)) {
          return 0xffffffffffffffff;
        }
      }
      local_8 = (long)dest + (long)src + in_RCX;
    }
  }
  return local_8;
}

Assistant:

size_t derEnc(octet der[], u32 tag, const void* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// t_count <- len(T)
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// l_count <- len(L)
	l_count = derLEnc(0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать?
	if (der)
	{
		ASSERT(memIsValid(val, len));
		ASSERT(memIsValid(der, t_count + l_count + len));
		// der <- TLV
		memMove(der + t_count + l_count, val, len);
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, len) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + len;
}